

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::exportContentTyp(D3MFExporter *this,string *filename)

{
  zip_t *pzVar1;
  DeadlyImportError *this_00;
  char *entryname;
  void *buf;
  size_t bufsize;
  string local_98 [32];
  string *local_78;
  string *exportTxt;
  string entry;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *filename_local;
  D3MFExporter *this_local;
  
  local_18 = filename;
  filename_local = &this->mArchiveName;
  if (this->m_zipArchive == (zip_t *)0x0) {
    entry.field_2._M_local_buf[0xb] = '\x01';
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"3MF-Export: Zip archive not valid, nullptr.",&local_39);
    DeadlyImportError::DeadlyImportError(this_00,&local_38);
    entry.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::__cxx11::string::string((string *)&exportTxt,(string *)filename);
  pzVar1 = this->m_zipArchive;
  entryname = (char *)std::__cxx11::string::c_str();
  zip_entry_open(pzVar1,entryname);
  std::__cxx11::ostringstream::str();
  local_78 = local_98;
  pzVar1 = this->m_zipArchive;
  buf = (void *)std::__cxx11::string::c_str();
  bufsize = std::__cxx11::string::size();
  zip_entry_write(pzVar1,buf,bufsize);
  zip_entry_close(this->m_zipArchive);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&exportTxt);
  return;
}

Assistant:

void D3MFExporter::exportContentTyp( const std::string &filename ) {
    if ( nullptr == m_zipArchive ) {
        throw DeadlyExportError( "3MF-Export: Zip archive not valid, nullptr." );
    }
    const std::string entry = filename;
    zip_entry_open( m_zipArchive, entry.c_str() );

    const std::string &exportTxt( mContentOutput.str() );
    zip_entry_write( m_zipArchive, exportTxt.c_str(), exportTxt.size() );

    zip_entry_close( m_zipArchive );
}